

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::visitContinueStatement
          (CodegenVisitor *this,ContinueStatement *continueStmt)

{
  size_type sVar1;
  uint uVar2;
  uint uVar3;
  SQFuncState *pSVar4;
  SQInteger SVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  SQInstruction local_20;
  
  lVar7 = (long)(continueStmt->super_JumpStatement).super_Statement.super_Node._coordinates.
                lineStart;
  if (lVar7 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar7,this->_lineinfo,false);
  }
  if ((this->_fs->_continuetargets)._size == 0) {
    reportDiagnostic(this,(Node *)continueStmt,0x26,"continue");
  }
  pSVar4 = this->_fs;
  lVar7 = (pSVar4->_continuetargets)._vals[(pSVar4->_continuetargets)._size - 1];
  if (0 < lVar7) {
    local_20._arg0 = (uchar)lVar7;
    local_20._0_5_ = 0x4300000000;
    local_20 = (SQInstruction)((ulong)local_20._4_2_ << 0x20);
    SQFuncState::AddInstruction(pSVar4,&local_20);
  }
  SVar5 = SQFuncState::GetStackSize(this->_fs);
  pSVar4 = this->_fs;
  lVar7 = (pSVar4->_blockstacksizes)._vals[(pSVar4->_blockstacksizes)._size - 1];
  if (SVar5 != lVar7) {
    SVar5 = SQFuncState::CountOuters(pSVar4,lVar7);
    if (SVar5 != 0) {
      pSVar4 = this->_fs;
      local_20.op = 'G';
      local_20._arg0 = '\0';
      local_20._arg2 = '\0';
      local_20._arg3 = '\0';
      local_20.field_0._arg1 =
           ((anon_union_4_2_91d81cc7_for_SQInstruction_0 *)
           ((pSVar4->_blockstacksizes)._vals + ((pSVar4->_blockstacksizes)._size - 1)))->_arg1;
      SQFuncState::AddInstruction(pSVar4,&local_20);
    }
  }
  local_20.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0xfffffb2e;
  local_20.op = '\"';
  local_20._arg0 = '\0';
  local_20._arg2 = '\0';
  local_20._arg3 = '\0';
  SQFuncState::AddInstruction(this->_fs,&local_20);
  pSVar4 = this->_fs;
  sVar1 = (pSVar4->_instructions)._size;
  uVar2 = (pSVar4->_unresolvedcontinues)._size;
  uVar3 = (pSVar4->_unresolvedcontinues)._allocated;
  if (uVar3 <= uVar2) {
    uVar2 = uVar2 * 2;
    uVar8 = 4;
    if (uVar2 != 0) {
      uVar8 = (ulong)uVar2;
    }
    plVar6 = (long *)sq_vm_realloc((pSVar4->_unresolvedcontinues)._alloc_ctx,
                                   (pSVar4->_unresolvedcontinues)._vals,(ulong)uVar3 << 3,uVar8 * 8)
    ;
    (pSVar4->_unresolvedcontinues)._vals = plVar6;
    (pSVar4->_unresolvedcontinues)._allocated = (size_type)uVar8;
  }
  uVar2 = (pSVar4->_unresolvedcontinues)._size;
  (pSVar4->_unresolvedcontinues)._size = uVar2 + 1;
  (pSVar4->_unresolvedcontinues)._vals[uVar2] = (ulong)(sVar1 - 1);
  return;
}

Assistant:

void CodegenVisitor::visitContinueStatement(ContinueStatement *continueStmt) {
    addLineNumber(continueStmt);
    if (_fs->_continuetargets.size() <= 0)
        reportDiagnostic(continueStmt, DiagnosticsId::DI_LOOP_CONTROLLER_NOT_IN_LOOP, "continue");
    if (_fs->_continuetargets.top() > 0) {
        _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
    }
    RESOLVE_OUTERS();
    _fs->AddInstruction(_OP_JMP, 0, -1234);
    _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
}